

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_statistics.h
# Opt level: O2

double __thiscall
embree::BVHNStatistics<8>::Statistics::NodeStat<embree::AABBNode_t<embree::NodeRefPtr<8>,_8>_>::sah
          (NodeStat<embree::AABBNode_t<embree::NodeRefPtr<8>,_8>_> *this,BVH *bvh)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar3 = vsubps_avx((undefined1  [16])(bvh->super_AccelData).bounds.bounds0.upper.field_0,
                      (undefined1  [16])(bvh->super_AccelData).bounds.bounds0.lower.field_0);
  auVar4 = vsubps_avx((undefined1  [16])(bvh->super_AccelData).bounds.bounds1.upper.field_0,
                      (undefined1  [16])(bvh->super_AccelData).bounds.bounds1.lower.field_0);
  auVar1 = vblendps_avx(auVar3,ZEXT816(0) << 0x40,8);
  auVar2 = vshufps_avx(auVar1,auVar1,0xc9);
  auVar4 = vblendps_avx(auVar4,ZEXT816(0) << 0x40,8);
  auVar5 = vshufps_avx(auVar4,auVar4,0xc9);
  auVar1 = vsubps_avx(auVar4,auVar1);
  auVar4 = vsubps_avx(auVar5,auVar2);
  auVar5._0_4_ = auVar1._0_4_ * auVar4._0_4_ * 0.33333334 +
                 auVar3._0_4_ * auVar2._0_4_ +
                 (auVar3._0_4_ * auVar4._0_4_ + auVar2._0_4_ * auVar1._0_4_) * 0.5;
  auVar5._4_4_ = auVar1._4_4_ * auVar4._4_4_ * 0.33333334 +
                 auVar3._4_4_ * auVar2._4_4_ +
                 (auVar3._4_4_ * auVar4._4_4_ + auVar2._4_4_ * auVar1._4_4_) * 0.5;
  auVar5._8_4_ = auVar1._8_4_ * auVar4._8_4_ * 0.33333334 +
                 auVar3._8_4_ * auVar2._8_4_ +
                 (auVar3._8_4_ * auVar4._8_4_ + auVar2._8_4_ * auVar1._8_4_) * 0.5;
  auVar5._12_4_ =
       auVar1._12_4_ * auVar4._12_4_ * 0.33333334 +
       auVar3._12_4_ * auVar2._12_4_ +
       (auVar3._12_4_ * auVar4._12_4_ + auVar2._12_4_ * auVar1._12_4_) * 0.5;
  auVar1 = vhaddps_avx(auVar5,auVar5);
  auVar4 = vshufpd_avx(auVar5,auVar5,1);
  return this->nodeSAH / (double)(auVar4._0_4_ + auVar1._0_4_);
}

Assistant:

double sah(BVH* bvh) const {
          return nodeSAH/bvh->getLinearBounds().expectedHalfArea();
        }